

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_alloc_helpers.hpp
# Opt level: O0

void * asio_handler_alloc_helpers::
       allocate<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long)>>>>>
                 (size_t s,
                 write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>_>
                 *h,size_t align)

{
  asio_handler_allocate_is_deprecated pvVar1;
  write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>_>
  *in_RDX;
  size_t in_RSI;
  
  pvVar1 = asio::detail::
           asio_handler_allocate<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long)>>>>
                     (in_RSI,in_RDX);
  return pvVar1;
}

Assistant:

inline void* allocate(std::size_t s, Handler& h,
    std::size_t align = ASIO_DEFAULT_ALIGN)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  return aligned_new(align, s);
#elif defined(ASIO_NO_DEPRECATED)
  // The asio_handler_allocate hook is no longer used to obtain memory.
  (void)&error_if_hooks_are_defined<Handler>;
  (void)h;
# if !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
  return asio::detail::thread_info_base::allocate(
      asio::detail::thread_context::top_of_thread_call_stack(),
      s, align);
# else // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
  return aligned_new(align, s);
# endif // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
#else
  (void)align;
  using asio::asio_handler_allocate;
  return asio_handler_allocate(s, asio::detail::addressof(h));
#endif
}